

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compare_unknown_test.cc
# Opt level: O3

void __thiscall CompareTest_LongVarint_Test::TestBody(CompareTest_LongVarint_Test *this)

{
  long lVar1;
  char *pcVar2;
  initializer_list<UnknownField> __l;
  initializer_list<UnknownField> __l_00;
  initializer_list<UnknownField> __l_01;
  initializer_list<UnknownField> __l_02;
  allocator_type local_14e;
  allocator_type local_14d;
  upb_UnknownCompareResult local_14c;
  internal local_148 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_140;
  upb_UnknownCompareResult local_134;
  vector<UnknownField,_std::allocator<UnknownField>_> local_130;
  vector<UnknownField,_std::allocator<UnknownField>_> local_118;
  vector<UnknownField,_std::allocator<UnknownField>_> local_100;
  vector<UnknownField,_std::allocator<UnknownField>_> local_e8;
  UnknownField local_d0;
  undefined4 local_a0;
  undefined8 local_98;
  undefined1 local_78;
  UnknownField local_70;
  undefined4 local_40;
  undefined8 local_38;
  undefined1 local_18;
  
  local_14c = kUpb_UnknownCompareResult_Equal;
  local_70.field_number = 1;
  local_70.value.super__Variant_base<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>.
  super__Move_assign_alias<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>.
  super__Copy_assign_alias<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>.
  super__Move_ctor_alias<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>.
  super__Copy_ctor_alias<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>.
  super__Variant_storage_alias<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>._M_u._M_first
  ._M_storage.val = (_Uninitialized<Varint,_true>)(Varint)0x7b;
  local_70.value.super__Variant_base<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>.
  super__Move_assign_alias<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>.
  super__Copy_assign_alias<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>.
  super__Move_ctor_alias<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>.
  super__Copy_ctor_alias<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>.
  super__Variant_storage_alias<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>._M_index =
       '\x01';
  local_40 = 2;
  local_38 = 0x1c8;
  local_18 = 1;
  __l._M_len = 2;
  __l._M_array = &local_70;
  std::vector<UnknownField,_std::allocator<UnknownField>_>::vector(&local_e8,__l,&local_14d);
  local_d0.field_number = 1;
  local_d0.value.super__Variant_base<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>.
  super__Move_assign_alias<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>.
  super__Copy_assign_alias<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>.
  super__Move_ctor_alias<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>.
  super__Copy_ctor_alias<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>.
  super__Variant_storage_alias<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>._M_u._M_first
  ._M_storage.val = (_Uninitialized<Varint,_true>)(Varint)0x7b;
  local_d0.value.super__Variant_base<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>.
  super__Move_assign_alias<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>.
  super__Copy_assign_alias<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>.
  super__Move_ctor_alias<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>.
  super__Copy_ctor_alias<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>.
  super__Variant_storage_alias<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>._M_index =
       '\0';
  local_a0 = 2;
  local_98 = 0x1c8;
  local_78 = 0;
  __l_00._M_len = 2;
  __l_00._M_array = &local_d0;
  std::vector<UnknownField,_std::allocator<UnknownField>_>::vector(&local_100,__l_00,&local_14e);
  local_134 = CompareUnknown(&local_e8,&local_100);
  testing::internal::CmpHelperEQ<upb_UnknownCompareResult,upb_UnknownCompareResult>
            (local_148,"kUpb_UnknownCompareResult_Equal",
             "CompareUnknown({{1, LongVarint(123)}, {2, LongVarint(456)}}, {{1, Varint(123)}, {2, Varint(456)}})"
             ,&local_14c,&local_134);
  std::vector<UnknownField,_std::allocator<UnknownField>_>::~vector(&local_100);
  lVar1 = 0x38;
  do {
    std::__detail::__variant::
    _Variant_storage<false,_Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>::
    ~_Variant_storage((_Variant_storage<false,_Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>
                       *)((long)&local_d0.field_number + lVar1));
    lVar1 = lVar1 + -0x30;
  } while (lVar1 != -0x28);
  std::vector<UnknownField,_std::allocator<UnknownField>_>::~vector(&local_e8);
  lVar1 = 0x38;
  do {
    std::__detail::__variant::
    _Variant_storage<false,_Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>::
    ~_Variant_storage((_Variant_storage<false,_Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>
                       *)((long)&local_70.field_number + lVar1));
    lVar1 = lVar1 + -0x30;
  } while (lVar1 != -0x28);
  if (local_148[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_70);
    if (local_140 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_140->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/compare_unknown_test.cc"
               ,0xb2,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_d0,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d0);
    if ((long *)CONCAT44(local_70._4_4_,local_70.field_number) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_70._4_4_,local_70.field_number) + 8))();
    }
  }
  if (local_140 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_140,local_140);
  }
  local_14c = kUpb_UnknownCompareResult_Equal;
  local_70.field_number = 2;
  local_70.value.super__Variant_base<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>.
  super__Move_assign_alias<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>.
  super__Copy_assign_alias<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>.
  super__Move_ctor_alias<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>.
  super__Copy_ctor_alias<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>.
  super__Variant_storage_alias<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>._M_u._M_first
  ._M_storage.val = (_Uninitialized<Varint,_true>)(Varint)0x1c8;
  local_70.value.super__Variant_base<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>.
  super__Move_assign_alias<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>.
  super__Copy_assign_alias<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>.
  super__Move_ctor_alias<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>.
  super__Copy_ctor_alias<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>.
  super__Variant_storage_alias<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>._M_index =
       '\x01';
  local_40 = 1;
  local_38 = 0x7b;
  local_18 = 1;
  __l_01._M_len = 2;
  __l_01._M_array = &local_70;
  std::vector<UnknownField,_std::allocator<UnknownField>_>::vector(&local_118,__l_01,&local_14d);
  local_d0.field_number = 1;
  local_d0.value.super__Variant_base<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>.
  super__Move_assign_alias<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>.
  super__Copy_assign_alias<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>.
  super__Move_ctor_alias<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>.
  super__Copy_ctor_alias<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>.
  super__Variant_storage_alias<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>._M_u._M_first
  ._M_storage.val = (_Uninitialized<Varint,_true>)(Varint)0x7b;
  local_d0.value.super__Variant_base<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>.
  super__Move_assign_alias<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>.
  super__Copy_assign_alias<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>.
  super__Move_ctor_alias<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>.
  super__Copy_ctor_alias<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>.
  super__Variant_storage_alias<Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>._M_index =
       '\0';
  local_a0 = 2;
  local_98 = 0x1c8;
  local_78 = 0;
  __l_02._M_len = 2;
  __l_02._M_array = &local_d0;
  std::vector<UnknownField,_std::allocator<UnknownField>_>::vector(&local_130,__l_02,&local_14e);
  local_134 = CompareUnknown(&local_118,&local_130);
  testing::internal::CmpHelperEQ<upb_UnknownCompareResult,upb_UnknownCompareResult>
            (local_148,"kUpb_UnknownCompareResult_Equal",
             "CompareUnknown({{2, LongVarint(456)}, {1, LongVarint(123)}}, {{1, Varint(123)}, {2, Varint(456)}})"
             ,&local_14c,&local_134);
  std::vector<UnknownField,_std::allocator<UnknownField>_>::~vector(&local_130);
  lVar1 = 0x38;
  do {
    std::__detail::__variant::
    _Variant_storage<false,_Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>::
    ~_Variant_storage((_Variant_storage<false,_Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>
                       *)((long)&local_d0.field_number + lVar1));
    lVar1 = lVar1 + -0x30;
  } while (lVar1 != -0x28);
  std::vector<UnknownField,_std::allocator<UnknownField>_>::~vector(&local_118);
  lVar1 = 0x38;
  do {
    std::__detail::__variant::
    _Variant_storage<false,_Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>::
    ~_Variant_storage((_Variant_storage<false,_Varint,_LongVarint,_Delimited,_Fixed64,_Fixed32,_Group>
                       *)((long)&local_70.field_number + lVar1));
    lVar1 = lVar1 + -0x30;
  } while (lVar1 != -0x28);
  if (local_148[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_70);
    if (local_140 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_140->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/compare_unknown_test.cc"
               ,0xb5,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_d0,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d0);
    if ((long *)CONCAT44(local_70._4_4_,local_70.field_number) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_70._4_4_,local_70.field_number) + 8))();
    }
  }
  if (local_140 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_140,local_140);
  }
  return;
}

Assistant:

TEST(CompareTest, LongVarint) {
  EXPECT_EQ(kUpb_UnknownCompareResult_Equal,
            CompareUnknown({{1, LongVarint(123)}, {2, LongVarint(456)}},
                           {{1, Varint(123)}, {2, Varint(456)}}));
  EXPECT_EQ(kUpb_UnknownCompareResult_Equal,
            CompareUnknown({{2, LongVarint(456)}, {1, LongVarint(123)}},
                           {{1, Varint(123)}, {2, Varint(456)}}));
}